

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

void Abc_SclFindCriticalNodeWindow_rec
               (SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vPath,float fSlack,int fDept)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Obj_t *pObj_00;
  uint uVar5;
  int Fill;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  uVar5 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar5 != 2) && (uVar5 != 5)) {
    pAVar3 = pObj->pNtk;
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,(int)vPath);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar4 = pObj->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pObj->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar1] = iVar2;
      if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                      ,0x85,
                      "void Abc_SclFindCriticalNodeWindow_rec(SC_Man *, Abc_Obj_t *, Vec_Int_t *, float, int)"
                     );
      }
      if (fDept == 0) {
        lVar7 = (long)(pObj->vFanins).nSize;
        if (lVar7 < 1) {
          fVar8 = 0.0;
        }
        else {
          fVar8 = 0.0;
          lVar6 = 0;
          do {
            uVar5 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]] + 0x10)
            ;
            fVar9 = p->pTimes[uVar5].rise;
            fVar10 = p->pTimes[uVar5].fall;
            if (fVar9 <= fVar10) {
              fVar9 = fVar10;
            }
            if (fVar8 <= fVar9) {
              fVar8 = fVar9;
            }
            lVar6 = lVar6 + 1;
          } while (lVar7 != lVar6);
        }
      }
      else {
        uVar5 = pObj->Id;
        fVar8 = p->pTimes[uVar5].rise + p->pDepts[uVar5].rise;
        fVar9 = p->pTimes[uVar5].fall + p->pDepts[uVar5].fall;
        if (fVar8 <= fVar9) {
          fVar8 = fVar9;
        }
        fVar8 = p->MaxDelay - fVar8;
      }
      if (0 < (pObj->vFanins).nSize) {
        if (fVar8 <= 0.0) {
          fVar8 = 0.0;
        }
        lVar7 = 0;
        do {
          pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar7]];
          uVar5 = *(uint *)&pObj_00->field_0x14 & 0xf;
          if (((uVar5 != 2) && (uVar5 != 5)) && ((pObj_00->vFanins).nSize != 0)) {
            if (uVar5 != 7) {
              __assert_fail("Abc_ObjIsNode(pNext)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                            ,0x93,
                            "void Abc_SclFindCriticalNodeWindow_rec(SC_Man *, Abc_Obj_t *, Vec_Int_t *, float, int)"
                           );
            }
            if (fDept == 0) {
              fVar9 = p->pTimes[(uint)pObj_00->Id].rise;
              fVar10 = p->pTimes[(uint)pObj_00->Id].fall;
              if (fVar9 <= fVar10) {
                fVar9 = fVar10;
              }
              fVar9 = fVar8 - fVar9;
            }
            else {
              uVar5 = pObj_00->Id;
              fVar9 = p->pTimes[uVar5].rise + p->pDepts[uVar5].rise;
              fVar10 = p->pTimes[uVar5].fall + p->pDepts[uVar5].fall;
              if (fVar9 <= fVar10) {
                fVar9 = fVar10;
              }
              fVar9 = (p->MaxDelay - fVar9) - fVar8;
            }
            if (0.0 <= fSlack - fVar9) {
              Abc_SclFindCriticalNodeWindow_rec(p,pObj_00,vPath,fSlack - fVar9,fDept);
            }
          }
          lVar7 = lVar7 + 1;
          iVar1 = (pObj->vFanins).nSize;
        } while (lVar7 < iVar1);
        if (0 < iVar1) {
          Vec_IntPush(vPath,pObj->Id);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_SclFindCriticalNodeWindow_rec( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vPath, float fSlack, int fDept )
{
    Abc_Obj_t * pNext;
    float fArrMax, fSlackFan;
    int i;
    if ( Abc_ObjIsCi(pObj) )
        return;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    // compute the max arrival time of the fanins
    if ( fDept )
//        fArrMax = p->pSlack[Abc_ObjId(pObj)];
        fArrMax = Abc_SclObjGetSlack(p, pObj, p->MaxDelay);
    else
        fArrMax = Abc_SclGetMaxDelayNodeFanins( p, pObj );
//    assert( fArrMax >= -1 );
    fArrMax = Abc_MaxFloat( fArrMax, 0 );
    // traverse all fanins whose arrival times are within a window
    Abc_ObjForEachFanin( pObj, pNext, i )
    {
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( fDept )
//            fSlackFan = fSlack - (p->pSlack[Abc_ObjId(pNext)] - fArrMax);
            fSlackFan = fSlack - (Abc_SclObjGetSlack(p, pNext, p->MaxDelay) - fArrMax);
        else
            fSlackFan = fSlack - (fArrMax - Abc_SclObjTimeMax(p, pNext));
        if ( fSlackFan >= 0 )
            Abc_SclFindCriticalNodeWindow_rec( p, pNext, vPath, fSlackFan, fDept );
    }
    if ( Abc_ObjFaninNum(pObj) > 0 )
        Vec_IntPush( vPath, Abc_ObjId(pObj) );
}